

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::decompressEAC_RG11(PixelBufferAccess *dst,deUint8 *src,bool signedMode)

{
  deInt16 dVar1;
  deUint16 dVar2;
  int iVar3;
  void *pvVar4;
  deUint64 src_00;
  deUint64 src_01;
  deInt16 *pdVar5;
  deUint16 *pdVar6;
  deUint16 *dstPixel_1;
  deUint16 *srcPixelG_1;
  deUint16 *srcPixelR_1;
  deInt16 *dstPixel;
  deInt16 *srcPixelG;
  deInt16 *srcPixelR;
  int x;
  int y;
  deUint8 uncompressedBlockG [32];
  deUint8 uncompressedBlockR [32];
  deUint64 compressedBlockG;
  deUint64 compressedBlockR;
  int dstPixelSize;
  int dstRowPitch;
  deUint8 *dstPtr;
  bool signedMode_local;
  deUint8 *src_local;
  PixelBufferAccess *dst_local;
  
  pvVar4 = PixelBufferAccess::getDataPtr(dst);
  iVar3 = ConstPixelBufferAccess::getRowPitch(&dst->super_ConstPixelBufferAccess);
  src_00 = EtcDecompressInternal::get128BitBlockStart(src,0);
  src_01 = EtcDecompressInternal::get128BitBlockEnd(src,0);
  EtcDecompressInternal::decompressEAC11Block(uncompressedBlockG + 0x18,src_00,signedMode);
  EtcDecompressInternal::decompressEAC11Block((deUint8 *)&x,src_01,signedMode);
  for (srcPixelR._4_4_ = 0; srcPixelR._4_4_ < 4; srcPixelR._4_4_ = srcPixelR._4_4_ + 1) {
    for (srcPixelR._0_4_ = 0; (int)srcPixelR < 4; srcPixelR._0_4_ = (int)srcPixelR + 1) {
      if (signedMode) {
        pdVar5 = (deInt16 *)
                 ((long)pvVar4 + (long)((int)srcPixelR << 2) + (long)(srcPixelR._4_4_ * iVar3));
        dVar1 = EtcDecompressInternal::extend11To16WithSign
                          (*(deInt16 *)
                            (uncompressedBlockG +
                            (long)((srcPixelR._4_4_ * 4 + (int)srcPixelR) * 2) + 0x18));
        *pdVar5 = dVar1;
        dVar1 = EtcDecompressInternal::extend11To16WithSign
                          (*(deInt16 *)
                            ((long)&x + (long)((srcPixelR._4_4_ * 4 + (int)srcPixelR) * 2)));
        pdVar5[1] = dVar1;
      }
      else {
        pdVar6 = (deUint16 *)
                 ((long)pvVar4 + (long)((int)srcPixelR << 2) + (long)(srcPixelR._4_4_ * iVar3));
        dVar2 = EtcDecompressInternal::extend11To16
                          (*(deUint16 *)
                            (uncompressedBlockG +
                            (long)((srcPixelR._4_4_ * 4 + (int)srcPixelR) * 2) + 0x18));
        *pdVar6 = dVar2;
        dVar2 = EtcDecompressInternal::extend11To16
                          (*(deUint16 *)
                            ((long)&x + (long)((srcPixelR._4_4_ * 4 + (int)srcPixelR) * 2)));
        pdVar6[1] = dVar2;
      }
    }
  }
  return;
}

Assistant:

void decompressEAC_RG11 (const PixelBufferAccess& dst, const deUint8* src, bool signedMode)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11;

	const deUint64	compressedBlockR = get128BitBlockStart(src, 0);
	const deUint64	compressedBlockG = get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockR[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];
	deUint8			uncompressedBlockG[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11];

	// Decompress.
	decompressEAC11Block(uncompressedBlockR, compressedBlockR, signedMode);
	decompressEAC11Block(uncompressedBlockG, compressedBlockG, signedMode);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RG11 == 4);

			if (signedMode)
			{
				const deInt16* const	srcPixelR	= (deInt16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deInt16* const	srcPixelG	= (deInt16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deInt16* const			dstPixel	= (deInt16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16WithSign(srcPixelR[0]);
				dstPixel[1] = extend11To16WithSign(srcPixelG[0]);
			}
			else
			{
				const deUint16* const	srcPixelR	= (deUint16*)&uncompressedBlockR[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				const deUint16* const	srcPixelG	= (deUint16*)&uncompressedBlockG[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11];
				deUint16* const			dstPixel	= (deUint16*)(dstPtr + y*dstRowPitch + x*dstPixelSize);

				dstPixel[0] = extend11To16(srcPixelR[0]);
				dstPixel[1] = extend11To16(srcPixelG[0]);
			}
		}
	}
}